

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O1

VariableIndex __thiscall
cnn::ComputationGraph::add_const_lookup
          (ComputationGraph *this,LookupParameters *p,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indices)

{
  iterator __position;
  pointer pVVar1;
  pointer pVVar2;
  pointer pVVar3;
  long *in_RCX;
  Node *local_30;
  
  __position._M_current = *(Node ***)(p->dim).d;
  *(int *)&(this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
           super__Vector_impl_data._M_start =
       (int)((ulong)((long)__position._M_current -
                    (long)(p->super_ParametersBase)._vptr_ParametersBase) >> 3);
  local_30 = (Node *)operator_new(0xa8);
  (local_30->dim).nd = 0;
  (local_30->dim).bd = 1;
  (local_30->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_30->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_30->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_30->_vptr_Node = (_func_int **)&PTR__LookupNode_0028f908;
  pVVar1 = (pointer)(indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
  pVVar2 = (pointer)indices[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (pointer)indices[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
  local_30[1]._vptr_Node =
       (_func_int **)
       (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_30[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_start = pVVar1;
  local_30[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_finish = pVVar2;
  local_30[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pVVar3;
  local_30[1].dim.d[0] =
       *(uint *)&indices[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  *(undefined1 (*) [32])(local_30[1].dim.d + 1) = ZEXT832(0) << 0x20;
  *(undefined4 *)&local_30[1].field_0x44 = 0;
  local_30[1].aux_mem = in_RCX;
  local_30[2]._vptr_Node = (_func_int **)indices;
  local_30[1].dim.d[0] = (uint)((ulong)(in_RCX[1] - *in_RCX) >> 2);
  if (__position._M_current == *(Node ***)((p->dim).d + 2)) {
    std::vector<cnn::Node*,std::allocator<cnn::Node*>>::_M_realloc_insert<cnn::Node*>
              ((vector<cnn::Node*,std::allocator<cnn::Node*>> *)p,__position,&local_30);
  }
  else {
    *__position._M_current = local_30;
    *(long *)(p->dim).d = *(long *)(p->dim).d + 8;
  }
  set_dim_for_new_node((ComputationGraph *)p,(VariableIndex *)this);
  return (VariableIndex)(uint)this;
}

Assistant:

VariableIndex ComputationGraph::add_const_lookup(LookupParameters* p, const std::vector<unsigned>* indices) {
  VariableIndex new_node_index(nodes.size());
  LookupNode* new_node = new LookupNode(p, indices);
  nodes.push_back(new_node);
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}